

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O0

void mserialize::detail::
     BuiltinSerializer<std::shared_ptr<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>::
     serialize<OutputStream>
               (shared_ptr<std::unique_ptr<int,_std::default_delete<int>_>_> *opt,
               OutputStream *ostream)

{
  bool bVar1;
  __shared_ptr_access<std::unique_ptr<int,_std::default_delete<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_RSI;
  __shared_ptr *in_RDI;
  uint6 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffee;
  undefined1 in_stack_ffffffffffffffef;
  undefined1 uVar2;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RDI);
  if (bVar1) {
    uVar2 = 1;
    serialize<unsigned_char,OutputStream>
              ((uchar *)in_RSI,
               (OutputStream *)
               CONCAT17(1,CONCAT16(in_stack_ffffffffffffffee,in_stack_ffffffffffffffe8)));
    std::
    __shared_ptr_access<std::unique_ptr<int,_std::default_delete<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator*(in_RSI);
    serialize<std::unique_ptr<int,std::default_delete<int>>,OutputStream>
              ((unique_ptr<int,_std::default_delete<int>_> *)in_RSI,
               (OutputStream *)
               CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffffee,in_stack_ffffffffffffffe8)));
  }
  else {
    serialize<unsigned_char,OutputStream>
              ((uchar *)in_RSI,
               (OutputStream *)CONCAT17(in_stack_ffffffffffffffef,(uint7)in_stack_ffffffffffffffe8))
    ;
  }
  return;
}

Assistant:

static void serialize(const Optional& opt, OutputStream& ostream)
  {
    if (opt)
    {
      mserialize::serialize(std::uint8_t{1}, ostream);
      mserialize::serialize(*opt, ostream);
    }
    else
    {
      mserialize::serialize(std::uint8_t{0}, ostream);
    }
  }